

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_dynamic_import_job(JSContext *ctx,int argc,JSValue *argv)

{
  int iVar1;
  JSRuntime *pJVar2;
  JSValue new_target;
  char *pcVar3;
  JSRefCountHeader *p;
  char *basename;
  char *filename;
  JSModuleDef *m;
  JSValue v;
  JSValue JVar4;
  JSValue val1;
  JSValue err;
  uint uStack_64;
  JSValueUnion local_58 [2];
  JSValueUnion local_48;
  int64_t iStack_40;
  
  if ((int)argv[2].tag == -7) {
    JVar4 = argv[3];
    val1.tag = argv[2].tag;
    val1.u.ptr = argv[2].u.ptr;
    basename = JS_ToCStringLen2(ctx,(size_t *)0x0,val1,0);
    pcVar3 = (char *)0x0;
    if ((basename != (char *)0x0) &&
       (filename = JS_ToCStringLen2(ctx,(size_t *)0x0,JVar4,0), pcVar3 = basename,
       filename != (char *)0x0)) {
      m = JS_RunModule(ctx,basename,filename);
      JS_FreeCString(ctx,filename);
      if ((m != (JSModuleDef *)0x0) &&
         (local_58 = (JSValueUnion  [2])js_get_module_ns(ctx,m), local_58[1]._0_4_ != 6)) {
        JVar4.tag = 3;
        JVar4.u.ptr = (void *)((ulong)uStack_64 << 0x20);
        JVar4 = JS_CallInternal(ctx,*argv,(JSValue)(ZEXT816(3) << 0x40),JVar4,1,(JSValue *)local_58,
                                2);
        if ((0xfffffff4 < (uint)JVar4.tag) &&
           (iVar1 = *JVar4.u.ptr, *(int *)JVar4.u.ptr = iVar1 + -1, iVar1 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar4);
        }
        if (0xfffffff4 < local_58[1]._0_4_) {
          iVar1 = *local_58[0].ptr;
          *(int *)local_58[0].ptr = iVar1 + -1;
          if (iVar1 < 2) {
            __JS_FreeValueRT(ctx->rt,(JSValue)local_58);
          }
        }
        goto LAB_0013971f;
      }
    }
  }
  else {
    JS_ThrowTypeError(ctx,"no function filename for import()");
    pcVar3 = (char *)0x0;
  }
  basename = pcVar3;
  pJVar2 = ctx->rt;
  local_48 = (JSValueUnion)(pJVar2->current_exception).u.ptr;
  iStack_40 = (pJVar2->current_exception).tag;
  (pJVar2->current_exception).u.int32 = 0;
  (pJVar2->current_exception).tag = 2;
  new_target.tag = 3;
  new_target.u.ptr = (void *)((ulong)uStack_64 << 0x20);
  JVar4 = JS_CallInternal(ctx,argv[1],(JSValue)(ZEXT816(3) << 0x40),new_target,1,
                          (JSValue *)&local_48,2);
  if ((0xfffffff4 < (uint)JVar4.tag) &&
     (iVar1 = *JVar4.u.ptr, *(int *)JVar4.u.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar4);
  }
  if ((0xfffffff4 < (uint)iStack_40) &&
     (iVar1 = *local_48.ptr, *(int *)local_48.ptr = iVar1 + -1, iVar1 < 2)) {
    v.tag = iStack_40;
    v.u.ptr = local_48.ptr;
    __JS_FreeValueRT(ctx->rt,v);
  }
LAB_0013971f:
  JS_FreeCString(ctx,basename);
  return (JSValue)(ZEXT816(3) << 0x40);
}

Assistant:

static JSValue js_dynamic_import_job(JSContext *ctx,
                                     int argc, JSValueConst *argv)
{
    JSValueConst *resolving_funcs = argv;
    JSValueConst basename_val = argv[2];
    JSValueConst specifier = argv[3];
    JSModuleDef *m;
    const char *basename = NULL, *filename;
    JSValue ret, err, ns;

    if (!JS_IsString(basename_val)) {
        JS_ThrowTypeError(ctx, "no function filename for import()");
        goto exception;
    }
    basename = JS_ToCString(ctx, basename_val);
    if (!basename)
        goto exception;

    filename = JS_ToCString(ctx, specifier);
    if (!filename)
        goto exception;
                     
    m = JS_RunModule(ctx, basename, filename);
    JS_FreeCString(ctx, filename);
    if (!m)
        goto exception;

    /* return the module namespace */
    ns = js_get_module_ns(ctx, m);
    if (JS_IsException(ns))
        goto exception;

    ret = JS_Call(ctx, resolving_funcs[0], JS_UNDEFINED,
                   1, (JSValueConst *)&ns);
    JS_FreeValue(ctx, ret); /* XXX: what to do if exception ? */
    JS_FreeValue(ctx, ns);
    JS_FreeCString(ctx, basename);
    return JS_UNDEFINED;
 exception:

    err = JS_GetException(ctx);
    ret = JS_Call(ctx, resolving_funcs[1], JS_UNDEFINED,
                   1, (JSValueConst *)&err);
    JS_FreeValue(ctx, ret); /* XXX: what to do if exception ? */
    JS_FreeValue(ctx, err);
    JS_FreeCString(ctx, basename);
    return JS_UNDEFINED;
}